

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::PickerPrivate::PickerPrivate(PickerPrivate *this,Picker *parent)

{
  this->q = parent;
  this->model = (QAbstractItemModel *)0x0;
  this->modelColumn = 0;
  QPersistentModelIndex::QPersistentModelIndex(&this->currentIndex);
  QPersistentModelIndex::QPersistentModelIndex(&this->root);
  QPersistentModelIndex::QPersistentModelIndex(&this->topItemIndex);
  this->drawItemOffset = 0;
  this->indexBeforeChange = -1;
  this->inserting = false;
  this->maxCount = 0x7fffffff;
  this->minStringLength = 6;
  this->maxStringWidth = 0x19;
  this->stringLength = 6;
  this->itemsCount = 5;
  this->itemTopMargin = 7;
  this->mouseMoveDelta = 0;
  (this->highlightColor).cspec = Invalid;
  this->itemSideMargin = 0;
  this->stringHeight = 0;
  (this->mousePos).xp = 0;
  (this->mousePos).yp = 0;
  *(undefined4 *)((long)&(this->mousePos).yp + 3) = 0;
  (this->highlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = 0;
  this->scroller = (Scroller *)0x0;
  return;
}

Assistant:

PickerPrivate( Picker * parent )
		:	q( parent )
		,	model( 0 )
		,	modelColumn( 0 )
		,	drawItemOffset( 0 )
		,	indexBeforeChange( -1 )
		,	inserting( false )
		,	maxCount( INT_MAX )
		,	minStringLength( 6 )
		,	maxStringWidth( 25 )
		,	stringLength( minStringLength )
		,	itemsCount( 5 )
		,	itemTopMargin( 7 )
		,	itemSideMargin( 0 )
		,	stringHeight( 0 )
		,	leftMouseButtonPressed( false )
		,	mouseWasMoved( false )
		,	wasPainted( false )
		,	mouseMoveDelta( 0 )
		,	scroller( 0 )
	{}